

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::identDot(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *pAVar1;
  bool bVar2;
  int iVar3;
  NoViableAltException *pNVar4;
  RefAST tmp16_AST;
  ASTPair currentAST;
  RefAST identDot_AST;
  RefCount<AST> local_d8;
  undefined1 local_d0 [16];
  RefCount<AST> RStack_c0;
  RefCount<AST> local_b8;
  RefCount<Token> local_b0;
  RefCount<Token> local_a8;
  RefCount<Token> local_a0;
  RefCount<Token> local_98;
  RefCount<Token> local_90;
  RefCount<Token> local_88;
  RefToken local_80;
  RefToken local_78;
  RefAST local_70;
  RefAST local_68;
  RefAST local_60;
  RefAST local_58;
  RefAST local_50;
  RefToken local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_b8.ref = nullAST.ref;
  local_d0._8_8_ = (factory_type)0x0;
  RStack_c0.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_b8.ref = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 0xd) {
LAB_00188494:
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    if (iVar3 == 0x12) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      if (iVar3 != 0xd) {
        iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
        if (iVar3 != 0x17) {
          iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
          if (iVar3 != 0x39) goto LAB_00188514;
        }
      }
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      local_d8.ref = nullAST.ref;
      if (iVar3 == 0xd) {
        if (nullAST.ref == (Ref *)0x0) {
          local_d8.ref = (Ref *)0x0;
        }
        else {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
        pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
        ASTFactory::create((ASTFactory *)local_d0,(RefToken *)pAVar1);
        RefCount<AST>::operator=(&local_d8,(RefCount<AST> *)local_d0);
        RefCount<AST>::~RefCount((RefCount<AST> *)local_d0);
        RefCount<Token>::~RefCount(&local_88);
        if (local_d8.ref == (Ref *)0x0) {
          local_38.ref = (Ref *)0x0;
        }
        else {
          (local_d8.ref)->count = (local_d8.ref)->count + 1;
          local_38.ref = local_d8.ref;
        }
        ASTFactory::addASTChild(pAVar1,(ASTPair *)(local_d0 + 8),&local_38);
        RefCount<AST>::~RefCount(&local_38);
        Parser::match((Parser *)this,0xd);
      }
      else {
        if (iVar3 != 0x39) {
          pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
          (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
          NoViableAltException::NoViableAltException(pNVar4,&local_48);
          __cxa_throw(pNVar4,&NoViableAltException::typeinfo,
                      NoViableAltException::~NoViableAltException);
        }
        if (nullAST.ref == (Ref *)0x0) {
          local_d8.ref = (Ref *)0x0;
        }
        else {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90,this,1);
        pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
        ASTFactory::create((ASTFactory *)local_d0,(RefToken *)pAVar1);
        RefCount<AST>::operator=(&local_d8,(RefCount<AST> *)local_d0);
        RefCount<AST>::~RefCount((RefCount<AST> *)local_d0);
        RefCount<Token>::~RefCount(&local_90);
        if (local_d8.ref == (Ref *)0x0) {
          local_40.ref = (Ref *)0x0;
        }
        else {
          (local_d8.ref)->count = (local_d8.ref)->count + 1;
          local_40.ref = local_d8.ref;
        }
        ASTFactory::addASTChild(pAVar1,(ASTPair *)(local_d0 + 8),&local_40);
        RefCount<AST>::~RefCount(&local_40);
        Parser::match((Parser *)this,0x39);
      }
      RefCount<AST>::~RefCount(&local_d8);
      local_d8.ref = nullAST.ref;
      if (nullAST.ref == (Ref *)0x0) {
        local_d8.ref = (Ref *)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
      pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
      ASTFactory::create((ASTFactory *)local_d0,(RefToken *)pAVar1);
      RefCount<AST>::operator=(&local_d8,(RefCount<AST> *)local_d0);
      RefCount<AST>::~RefCount((RefCount<AST> *)local_d0);
      RefCount<Token>::~RefCount(&local_98);
      if (local_d8.ref == (Ref *)0x0) {
        local_50.ref = (Ref *)0x0;
      }
      else {
        (local_d8.ref)->count = (local_d8.ref)->count + 1;
        local_50.ref = local_d8.ref;
      }
      ASTFactory::makeASTRoot(pAVar1,(ASTPair *)(local_d0 + 8),&local_50);
      RefCount<AST>::~RefCount(&local_50);
      Parser::match((Parser *)this,0x12);
      identDot(this);
      local_58.ref = this_00->ref;
      if (local_58.ref == (Ref *)0x0) {
        local_58.ref = (Ref *)0x0;
      }
      else {
        (local_58.ref)->count = (local_58.ref)->count + 1;
      }
      ASTFactory::addASTChild(pAVar1,(ASTPair *)(local_d0 + 8),&local_58);
      RefCount<AST>::~RefCount(&local_58);
      goto LAB_001889c6;
    }
  }
  else {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 == 0x39) goto LAB_00188494;
  }
LAB_00188514:
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 != 0xd) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 != 0x17) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if (iVar3 != 0x39) goto LAB_00188a1a;
    }
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
  bVar2 = BitSet::member(&_tokenSet_6,iVar3);
  if (bVar2) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    bVar2 = BitSet::member(&_tokenSet_4,iVar3);
    if (bVar2) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      local_d8.ref = nullAST.ref;
      if (iVar3 == 0x39) {
        if (nullAST.ref == (Ref *)0x0) {
          local_d8.ref = (Ref *)0x0;
        }
        else {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_a8,this,1);
        pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
        ASTFactory::create((ASTFactory *)local_d0,(RefToken *)pAVar1);
        RefCount<AST>::operator=(&local_d8,(RefCount<AST> *)local_d0);
        RefCount<AST>::~RefCount((RefCount<AST> *)local_d0);
        RefCount<Token>::~RefCount(&local_a8);
        if (local_d8.ref == (Ref *)0x0) {
          local_68.ref = (Ref *)0x0;
        }
        else {
          (local_d8.ref)->count = (local_d8.ref)->count + 1;
          local_68.ref = local_d8.ref;
        }
        ASTFactory::addASTChild(pAVar1,(ASTPair *)(local_d0 + 8),&local_68);
        RefCount<AST>::~RefCount(&local_68);
        Parser::match((Parser *)this,0x39);
      }
      else if (iVar3 == 0x17) {
        if (nullAST.ref == (Ref *)0x0) {
          local_d8.ref = (Ref *)0x0;
        }
        else {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_b0,this,1);
        pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
        ASTFactory::create((ASTFactory *)local_d0,(RefToken *)pAVar1);
        RefCount<AST>::operator=(&local_d8,(RefCount<AST> *)local_d0);
        RefCount<AST>::~RefCount((RefCount<AST> *)local_d0);
        RefCount<Token>::~RefCount(&local_b0);
        if (local_d8.ref == (Ref *)0x0) {
          local_70.ref = (Ref *)0x0;
        }
        else {
          (local_d8.ref)->count = (local_d8.ref)->count + 1;
          local_70.ref = local_d8.ref;
        }
        ASTFactory::addASTChild(pAVar1,(ASTPair *)(local_d0 + 8),&local_70);
        RefCount<AST>::~RefCount(&local_70);
        Parser::match((Parser *)this,0x17);
      }
      else {
        if (iVar3 != 0xd) {
          pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
          (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
          NoViableAltException::NoViableAltException(pNVar4,&local_78);
          __cxa_throw(pNVar4,&NoViableAltException::typeinfo,
                      NoViableAltException::~NoViableAltException);
        }
        if (nullAST.ref == (Ref *)0x0) {
          local_d8.ref = (Ref *)0x0;
        }
        else {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_a0,this,1);
        pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
        ASTFactory::create((ASTFactory *)local_d0,(RefToken *)pAVar1);
        RefCount<AST>::operator=(&local_d8,(RefCount<AST> *)local_d0);
        RefCount<AST>::~RefCount((RefCount<AST> *)local_d0);
        RefCount<Token>::~RefCount(&local_a0);
        if (local_d8.ref == (Ref *)0x0) {
          local_60.ref = (Ref *)0x0;
        }
        else {
          (local_d8.ref)->count = (local_d8.ref)->count + 1;
          local_60.ref = local_d8.ref;
        }
        ASTFactory::addASTChild(pAVar1,(ASTPair *)(local_d0 + 8),&local_60);
        RefCount<AST>::~RefCount(&local_60);
        Parser::match((Parser *)this,0xd);
      }
LAB_001889c6:
      RefCount<AST>::~RefCount(&local_d8);
      RefCount<AST>::operator=(&local_b8,(RefCount<AST> *)(local_d0 + 8));
      RefCount<AST>::operator=(this_00,&local_b8);
      RefCount<AST>::~RefCount(&local_b8);
      RefCount<AST>::~RefCount(&RStack_c0);
      RefCount<AST>::~RefCount((RefCount<AST> *)(local_d0 + 8));
      return;
    }
  }
LAB_00188a1a:
  pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
  NoViableAltException::NoViableAltException(pNVar4,&local_80);
  __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::identDot() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST identDot_AST = nullAST;
	
	try {      // for error handling
		{
		if ((LA(1)==IDENT||LA(1)==LITERAL_position) && (LA(2)==OP_DOT) && (LA(3)==IDENT||LA(3)==LITERAL_glyph||LA(3)==LITERAL_position)) {
			{
			switch ( LA(1)) {
			case IDENT:
			{
				RefAST tmp14_AST = nullAST;
				tmp14_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp14_AST);
				match(IDENT);
				break;
			}
			case LITERAL_position:
			{
				RefAST tmp15_AST = nullAST;
				tmp15_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp15_AST);
				match(LITERAL_position);
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			RefAST tmp16_AST = nullAST;
			tmp16_AST = astFactory.create(LT(1));
			astFactory.makeASTRoot(currentAST, tmp16_AST);
			match(OP_DOT);
			identDot();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==IDENT||LA(1)==LITERAL_glyph||LA(1)==LITERAL_position) && (_tokenSet_6.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			{
			switch ( LA(1)) {
			case IDENT:
			{
				RefAST tmp17_AST = nullAST;
				tmp17_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp17_AST);
				match(IDENT);
				break;
			}
			case LITERAL_position:
			{
				RefAST tmp18_AST = nullAST;
				tmp18_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp18_AST);
				match(LITERAL_position);
				break;
			}
			case LITERAL_glyph:
			{
				RefAST tmp19_AST = nullAST;
				tmp19_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp19_AST);
				match(LITERAL_glyph);
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		identDot_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_6);
	}
	returnAST = identDot_AST;
}